

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualIterator.hpp
# Opt level: O0

VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
 Lib::
 VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
 ::getEmpty(void)

{
  int iVar1;
  IteratorCore<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
  *core;
  IteratorCore<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
  *in_RDI;
  
  if (VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>
      ::getEmpty()::inst == '\0') {
    iVar1 = __cxa_guard_acquire(&VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>
                                 ::getEmpty()::inst);
    if (iVar1 != 0) {
      core = (IteratorCore<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
              *)EmptyIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>
                ::operator_new(0x43bafa);
      EmptyIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
      ::EmptyIterator((EmptyIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
                       *)core);
      VirtualIterator(&getEmpty::inst,core);
      __cxa_atexit(~VirtualIterator,&getEmpty::inst,&__dso_handle);
      __cxa_guard_release(&VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>
                           ::getEmpty()::inst);
    }
  }
  VirtualIterator((VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
                   *)in_RDI,&getEmpty::inst);
  return (VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
          )in_RDI;
}

Assistant:

static VirtualIterator getEmpty()
  {
    static VirtualIterator inst(new EmptyIterator<T>());
    return inst;
  }